

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkPartStitchChoices(Abc_Ntk_t *pNtk,Vec_Ptr_t *vParts)

{
  Abc_Aig_t *pMan_00;
  Nm_Man_t *pNVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *p1;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Hop_Man_t *pMan_01;
  int local_58;
  int iNodeId;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Hop_Man_t *pMan;
  Vec_Ptr_t *vParts_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x3f2,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  iNodeId = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(vParts);
    if (iVar2 <= iNodeId) {
      for (iNodeId = 0; iVar2 = Abc_NtkCoNum(pNtk), iNodeId < iVar2; iNodeId = iNodeId + 1) {
        pAVar5 = Abc_NtkCo(pNtk,iNodeId);
        iVar2 = Abc_ObjFaninNum((pAVar5->field_6).pCopy);
        if (iVar2 == 0) {
          pAVar3 = (pAVar5->field_6).pCopy;
          pAVar5 = Abc_ObjChild0Copy(pAVar5);
          Abc_ObjAddFanin(pAVar3,pAVar5);
        }
      }
      pMan_01 = Abc_NtkPartStartHop(pNtk_00);
      pNtk_local = Abc_NtkHopRemoveLoops(pNtk_00,pMan_01);
      Abc_NtkDelete(pNtk_00);
      iVar2 = Abc_NtkCheck(pNtk_local);
      if (iVar2 == 0) {
        printf("Abc_NtkPartStitchChoices: The network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      return pNtk_local;
    }
    pNtk_01 = (Abc_Ntk_t *)Vec_PtrEntry(vParts,iNodeId);
    iVar2 = Abc_NtkIsStrash(pNtk_01);
    if (iVar2 == 0) break;
    Abc_NtkCleanCopy(pNtk_01);
    pAVar5 = Abc_AigConst1(pNtk_00);
    pAVar3 = Abc_AigConst1(pNtk_01);
    (pAVar3->field_6).pCopy = pAVar5;
    for (local_58 = 0; iVar2 = Abc_NtkCiNum(pNtk_01), local_58 < iVar2; local_58 = local_58 + 1) {
      pAVar5 = Abc_NtkCi(pNtk_01,local_58);
      pNVar1 = pNtk_00->pManName;
      pcVar4 = Abc_ObjName(pAVar5);
      iVar2 = Nm_ManFindIdByNameTwoTypes(pNVar1,pcVar4,2,5);
      if (iVar2 == -1) {
        pcVar4 = Abc_ObjName(pAVar5);
        printf("Cannot find CI node %s in the original network.\n",pcVar4);
        return (Abc_Ntk_t *)0x0;
      }
      pAVar3 = Abc_NtkObj(pNtk_00,iVar2);
      (pAVar5->field_6).pCopy = pAVar3;
    }
    p = Abc_AigDfs(pNtk_01,1,0);
    for (local_58 = 0; iVar2 = Vec_PtrSize(p), local_58 < iVar2; local_58 = local_58 + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p,local_58);
      pMan_00 = (Abc_Aig_t *)pNtk_00->pManFunc;
      pAVar3 = Abc_ObjChild0Copy(pAVar5);
      p1 = Abc_ObjChild1Copy(pAVar5);
      pAVar3 = Abc_AigAnd(pMan_00,pAVar3,p1);
      (pAVar5->field_6).pCopy = pAVar3;
      iVar2 = Abc_ObjIsComplement((pAVar5->field_6).pCopy);
      if (iVar2 != 0) {
        __assert_fail("!Abc_ObjIsComplement(pObj->pCopy)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                      ,0x40d,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      iVar2 = Abc_AigNodeIsChoice(pAVar5);
      if (iVar2 != 0) {
        for (_k = (pAVar5->field_5).pData; _k != (void *)0x0; _k = *(void **)((long)_k + 0x38)) {
          *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)(*(long *)((long)_k + 0x40) + 0x40) =
               pAVar5->field_6;
        }
      }
    }
    Vec_PtrFree(p);
    for (local_58 = 0; iVar2 = Abc_NtkCoNum(pNtk_01), local_58 < iVar2; local_58 = local_58 + 1) {
      pAVar5 = Abc_NtkCo(pNtk_01,local_58);
      pNVar1 = pNtk_00->pManName;
      pcVar4 = Abc_ObjName(pAVar5);
      iVar2 = Nm_ManFindIdByNameTwoTypes(pNVar1,pcVar4,3,4);
      if (iVar2 == -1) {
        pcVar4 = Abc_ObjName(pAVar5);
        printf("Cannot find CO node %s in the original network.\n",pcVar4);
        return (Abc_Ntk_t *)0x0;
      }
      pAVar3 = Abc_NtkObj(pNtk_00,iVar2);
      (pAVar5->field_6).pCopy = pAVar3;
      pAVar3 = (pAVar5->field_6).pCopy;
      pAVar5 = Abc_ObjChild0Copy(pAVar5);
      Abc_ObjAddFanin(pAVar3,pAVar5);
    }
    iNodeId = iNodeId + 1;
  }
  __assert_fail("Abc_NtkIsStrash(pNtkTemp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                ,0x3f8,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkPartStitchChoices( Abc_Ntk_t * pNtk, Vec_Ptr_t * vParts )
{
    extern Abc_Ntk_t * Abc_NtkHopRemoveLoops( Abc_Ntk_t * pNtk, Hop_Man_t * pMan );
    Hop_Man_t * pMan;
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew, * pNtkTemp;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, iNodeId;

    // start a new network similar to the original one
    assert( Abc_NtkIsStrash(pNtk) );
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );

    // annotate parts to point to the new network
    Vec_PtrForEachEntry( Abc_Ntk_t *, vParts, pNtkTemp, i )
    {
        assert( Abc_NtkIsStrash(pNtkTemp) );
        Abc_NtkCleanCopy( pNtkTemp );

        // map the CI nodes
        Abc_AigConst1(pNtkTemp)->pCopy = Abc_AigConst1(pNtkNew);
        Abc_NtkForEachCi( pNtkTemp, pObj, k )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
            if ( iNodeId == -1 )
            {
                printf( "Cannot find CI node %s in the original network.\n", Abc_ObjName(pObj) );
                return NULL;
            }
            pObj->pCopy = Abc_NtkObj( pNtkNew, iNodeId );
        }

        // add the internal nodes while saving representatives
        vNodes = Abc_AigDfs( pNtkTemp, 1, 0 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, k )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            assert( !Abc_ObjIsComplement(pObj->pCopy) );
            if ( Abc_AigNodeIsChoice(pObj) )
                for ( pFanin = (Abc_Obj_t *)pObj->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
                    pFanin->pCopy->pCopy = pObj->pCopy;
        }
        Vec_PtrFree( vNodes );

        // map the CO nodes
        Abc_NtkForEachCo( pNtkTemp, pObj, k )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(pObj), ABC_OBJ_PO, ABC_OBJ_BI );
            if ( iNodeId == -1 )
            {
                printf( "Cannot find CO node %s in the original network.\n", Abc_ObjName(pObj) );
                return NULL;
            }
            pObj->pCopy = Abc_NtkObj( pNtkNew, iNodeId );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
        }
    }

    // connect the remaining POs
/*
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCi( pNtkNew, i );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCo( pNtkNew, i );
*/
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj->pCopy) == 0 )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    }

    // transform into the HOP manager
    pMan = Abc_NtkPartStartHop( pNtkNew );
    pNtkNew = Abc_NtkHopRemoveLoops( pNtkTemp = pNtkNew, pMan );
    Abc_NtkDelete( pNtkTemp );

    // check correctness of the new network
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkPartStitchChoices: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}